

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O2

int XLearnFit(XL *out,char *model_path)

{
  Solver *this;
  HyperParam *hyper_param;
  float fVar1;
  allocator local_41;
  string local_40;
  Timer timer;
  
  Timer::Timer(&timer);
  Timer::tic(&timer);
  hyper_param = (HyperParam *)*out;
  std::__cxx11::string::string((string *)&local_40,model_path,&local_41);
  std::__cxx11::string::operator=((string *)&hyper_param->model_file,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  this = (Solver *)(hyper_param + 1);
  hyper_param->is_train = true;
  xLearn::Solver::Initialize(this,hyper_param);
  xLearn::Solver::StartWork(this);
  xLearn::Solver::Clear(this);
  fVar1 = Timer::toc(&timer);
  StringPrintf_abi_cxx11_(&local_40,"Total time cost: %.2f (sec)",(double)fVar1);
  Color::print_info(&local_40,true);
  std::__cxx11::string::~string((string *)&local_40);
  return 0;
}

Assistant:

XL_DLL int XLearnFit(XL *out, const char *model_path) {
  API_BEGIN();
  Timer timer;
  timer.tic();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  xl->GetHyperParam().model_file = std::string(model_path);
  xl->GetHyperParam().is_train = true;
  xl->GetSolver().Initialize(xl->GetHyperParam());
  xl->GetSolver().StartWork();
  xl->GetSolver().Clear();
  Color::print_info(
    StringPrintf("Total time cost: %.2f (sec)", 
    timer.toc()), true);
  API_END();
}